

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

int __thiscall QTextDocumentPrivate::remove(QTextDocumentPrivate *this,char *__filename)

{
  undefined1 *puVar1;
  QTextCursorPrivate *this_00;
  ulong uVar2;
  int in_EAX;
  AdjustResult AVar3;
  int extraout_EAX;
  Operation in_ECX;
  int in_EDX;
  Data *pDVar4;
  ulong uVar5;
  
  if (in_EDX == 0) {
    return in_EAX;
  }
  this->field_0x294 = this->field_0x294 | 2;
  move(this,(int)__filename,-1,in_EDX,in_ECX);
  this->field_0x294 = this->field_0x294 & 0xfd;
  pDVar4 = (this->cursors).q_hash.d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
    uVar5 = 0;
LAB_004d25c8:
    if (pDVar4 == (Data *)0x0 && uVar5 == 0) goto LAB_004d2664;
  }
  else {
    if (pDVar4->spans->offsets[0] == 0xff) {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (pDVar4->numBuckets == uVar5) {
          pDVar4 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar2 = uVar5 + 1;
      } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
      goto LAB_004d25c8;
    }
    uVar5 = 0;
  }
  do {
    this_00 = *(QTextCursorPrivate **)
               pDVar4->spans[uVar5 >> 7].entries
               [pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f]].storage.data;
    AVar3 = QTextCursorPrivate::adjustPosition(this_00,(int)__filename,-in_EDX,in_ECX);
    if (AVar3 == CursorMoved) {
      puVar1 = &this_00->field_0x28;
      *puVar1 = *puVar1 | 4;
    }
    do {
      if (pDVar4->numBuckets - 1 == uVar5) {
        pDVar4 = (Data *)0x0;
        uVar5 = 0;
        break;
      }
      uVar5 = uVar5 + 1;
    } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
  } while ((pDVar4 != (Data *)0x0) || (uVar5 != 0));
LAB_004d2664:
  finishEdit(this);
  return extraout_EAX;
}

Assistant:

void QTextDocumentPrivate::remove(int pos, int length, QTextUndoCommand::Operation op)
{
    if (length == 0)
        return;
    blockCursorAdjustment = true;
    move(pos, -1, length, op);
    blockCursorAdjustment = false;
    for (QTextCursorPrivate *curs : std::as_const(cursors)) {
        if (curs->adjustPosition(pos, -length, op) == QTextCursorPrivate::CursorMoved) {
            curs->changed = true;
        }
    }
    finishEdit();
}